

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O3

unique_ptr<Sock,_std::default_delete<Sock>_>
ConnectThroughProxy(Proxy *proxy,string *dest,uint16_t port,bool *proxy_connection_failed)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  undefined6 in_register_00000012;
  undefined1 *in_R8;
  long in_FS_OFFSET;
  ProxyCredentials random_auth;
  __atomic_base<int> local_a4;
  undefined1 local_a0 [40];
  ProxyCredentials local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  Proxy::Connect((Proxy *)local_a0);
  if ((Sock *)local_a0._0_8_ == (Sock *)0x0) {
    *in_R8 = 1;
    (proxy->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
    goto LAB_006c7583;
  }
  if (*(char *)((long)&dest[2]._M_string_length + 1) == '\x01') {
    paVar1 = &local_78.username.field_2;
    local_78.username._M_string_length = 0;
    local_78.username.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_78.password.field_2;
    local_78.password._M_string_length = 0;
    local_78.password.field_2._M_local_buf[0] = '\0';
    LOCK();
    UNLOCK();
    local_a4 = ConnectThroughProxy::counter.super___atomic_base<int>._M_i;
    ConnectThroughProxy::counter.super___atomic_base<int>._M_i =
         (__atomic_base<int>)
         (__atomic_base<int>)(ConnectThroughProxy::counter.super___atomic_base<int>._M_i + 1)._M_i;
    local_78.username._M_dataplus._M_p = (pointer)paVar1;
    local_78.password._M_dataplus._M_p = (pointer)paVar2;
    tinyformat::format<int>((string *)(local_a0 + 8),"%i",&local_a4._M_i);
    __str = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_78.password,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_a0 + 8));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_78.username,__str);
    ConnectThroughProxy();
    bVar3 = Socks5((string *)CONCAT62(in_register_00000012,port),(uint16_t)proxy_connection_failed,
                   &local_78,(Sock *)local_a0._0_8_);
    if (!bVar3) {
      (proxy->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.password._M_dataplus._M_p != paVar2) {
        operator_delete(local_78.password._M_dataplus._M_p,
                        CONCAT71(local_78.password.field_2._M_allocated_capacity._1_7_,
                                 local_78.password.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.username._M_dataplus._M_p != paVar1) {
        operator_delete(local_78.username._M_dataplus._M_p,
                        CONCAT71(local_78.username.field_2._M_allocated_capacity._1_7_,
                                 local_78.username.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_006c757a;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.password._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.password._M_dataplus._M_p,
                      CONCAT71(local_78.password.field_2._M_allocated_capacity._1_7_,
                               local_78.password.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.username._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.username._M_dataplus._M_p,
                      CONCAT71(local_78.username.field_2._M_allocated_capacity._1_7_,
                               local_78.username.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    bVar3 = Socks5((string *)CONCAT62(in_register_00000012,port),(uint16_t)proxy_connection_failed,
                   (ProxyCredentials *)0x0,(Sock *)local_a0._0_8_);
    if (!bVar3) {
      (proxy->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
LAB_006c757a:
      (*((Sock *)local_a0._0_8_)->_vptr_Sock[1])(local_a0._0_8_);
      goto LAB_006c7583;
    }
  }
  (proxy->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)local_a0._0_8_;
LAB_006c7583:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
           (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)proxy;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> ConnectThroughProxy(const Proxy& proxy,
                                          const std::string& dest,
                                          uint16_t port,
                                          bool& proxy_connection_failed)
{
    // first connect to proxy server
    auto sock = proxy.Connect();
    if (!sock) {
        proxy_connection_failed = true;
        return {};
    }

    // do socks negotiation
    if (proxy.m_randomize_credentials) {
        ProxyCredentials random_auth;
        static std::atomic_int counter(0);
        random_auth.username = random_auth.password = strprintf("%i", counter++);
        if (!Socks5(dest, port, &random_auth, *sock)) {
            return {};
        }
    } else {
        if (!Socks5(dest, port, nullptr, *sock)) {
            return {};
        }
    }
    return sock;
}